

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O2

SRes WaitId(CSzData *sd,UInt32 id)

{
  SRes SVar1;
  UInt64 in_RAX;
  UInt64 type;
  
  type = in_RAX;
  do {
    SVar1 = ReadNumber(sd,&type);
    if (SVar1 != 0) {
      return SVar1;
    }
    if (type == id) {
      return 0;
    }
    if (type == 0) {
      return 0x10;
    }
    SVar1 = SkipData(sd);
  } while (SVar1 == 0);
  return SVar1;
}

Assistant:

static SRes WaitId(CSzData *sd, UInt32 id)
{
  for (;;)
  {
    UInt64 type;
    RINOK(ReadID(sd, &type));
    if (type == id)
      return SZ_OK;
    if (type == k7zIdEnd)
      return SZ_ERROR_ARCHIVE;
    RINOK(SkipData(sd));
  }
}